

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.h
# Opt level: O2

void __thiscall dynet::CyclicalSGDTrainer::cyclic_update_eta(CyclicalSGDTrainer *this)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  
  uVar2 = this->it;
  fVar1 = this->e_min;
  fVar4 = this->step_size;
  fVar3 = floorf((float)uVar2 / (fVar4 + fVar4) + 1.0);
  fVar3 = 1.0 - ABS(((float)uVar2 / fVar4 - (fVar3 + fVar3)) + 1.0);
  fVar4 = 0.0;
  if (0.0 < fVar3) {
    fVar4 = this->e_max;
    dVar5 = ::pow((double)this->gamma,(double)uVar2);
    fVar4 = (float)dVar5 * fVar3 * (fVar4 - fVar1);
    uVar2 = this->it;
  }
  (this->super_Trainer).learning_rate = fVar1 + fVar4;
  this->it = uVar2 + 1;
  return;
}

Assistant:

void cyclic_update_eta() {
    float cycle = std::floor(1 + ((float) it)  / (2 * step_size));
    float x = std::abs( ((float) it) / step_size - 2 * cycle + 1);
    learning_rate = e_min + ((1 - x) > 0 ? (e_max - e_min) * (1 - x) * (real)std::pow(gamma, it) : 0);
    it++;
  }